

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O0

utf8proc_ssize_t
utf8proc_map(utf8proc_uint8_t *str,utf8proc_ssize_t strlen,utf8proc_uint8_t **dstptr,
            utf8proc_option_t options)

{
  void *pvVar1;
  utf8proc_int32_t *newptr;
  utf8proc_ssize_t result;
  utf8proc_int32_t *buffer;
  utf8proc_option_t options_local;
  utf8proc_uint8_t **dstptr_local;
  utf8proc_ssize_t strlen_local;
  utf8proc_uint8_t *str_local;
  
  *dstptr = (utf8proc_uint8_t *)0x0;
  str_local = (utf8proc_uint8_t *)utf8proc_decompose(str,strlen,(utf8proc_int32_t *)0x0,0,options);
  if (-1 < (long)str_local) {
    result = (utf8proc_ssize_t)malloc((long)str_local * 4 + 1);
    if ((utf8proc_int32_t *)result == (utf8proc_int32_t *)0x0) {
      str_local = (utf8proc_uint8_t *)0xffffffffffffffff;
    }
    else {
      str_local = (utf8proc_uint8_t *)
                  utf8proc_decompose(str,strlen,(utf8proc_int32_t *)result,
                                     (utf8proc_ssize_t)str_local,options);
      if ((long)str_local < 0) {
        free((void *)result);
      }
      else {
        str_local = (utf8proc_uint8_t *)
                    utf8proc_reencode((utf8proc_int32_t *)result,(utf8proc_ssize_t)str_local,options
                                     );
        if ((long)str_local < 0) {
          free((void *)result);
        }
        else {
          pvVar1 = realloc((void *)result,(size_t)(str_local + 1));
          if (pvVar1 != (void *)0x0) {
            result = (utf8proc_ssize_t)pvVar1;
          }
          *dstptr = (utf8proc_uint8_t *)result;
        }
      }
    }
  }
  return (utf8proc_ssize_t)str_local;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_ssize_t utf8proc_map(
  const utf8proc_uint8_t *str, utf8proc_ssize_t strlen, utf8proc_uint8_t **dstptr, utf8proc_option_t options
) {
  utf8proc_int32_t *buffer;
  utf8proc_ssize_t result;
  *dstptr = NULL;
  result = utf8proc_decompose(str, strlen, NULL, 0, options);
  if (result < 0) return result;
  buffer = (utf8proc_int32_t *) malloc(result * sizeof(utf8proc_int32_t) + 1);
  if (!buffer) return UTF8PROC_ERROR_NOMEM;
  result = utf8proc_decompose(str, strlen, buffer, result, options);
  if (result < 0) {
    free(buffer);
    return result;
  }
  result = utf8proc_reencode(buffer, result, options);
  if (result < 0) {
    free(buffer);
    return result;
  }
  {
    utf8proc_int32_t *newptr;
    newptr = (utf8proc_int32_t *) realloc(buffer, (size_t)result+1);
    if (newptr) buffer = newptr;
  }
  *dstptr = (utf8proc_uint8_t *)buffer;
  return result;
}